

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::reserve(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  int i;
  ulong uVar4;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  
  if (this->ptr == (ParsedParameter **)0x0) {
    uVar3 = 8;
  }
  else {
    uVar3 = this->nAlloc;
  }
  if (uVar3 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
    uVar3 = this->nStored;
    for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
      paVar5 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)this->ptr;
      if ((anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)this->ptr ==
          (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
           *)0x0) {
        paVar5 = &this->field_2;
      }
      ((ParsedParameter **)CONCAT44(extraout_var,iVar2))[uVar4] = paVar5->fixed[uVar4];
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 3,8);
    this->nAlloc = n;
    this->ptr = (ParsedParameter **)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }